

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extract.hpp
# Opt level: O1

array<double,_7UL> *
njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::SammyBackgroundRMatrix::extract
          (array<double,_7UL> *__return_storage_ptr__,ListRecord *record)

{
  undefined1 auVar1 [16];
  pointer pdVar2;
  undefined1 auVar3 [16];
  double dVar4;
  double dVar5;
  double dVar6;
  undefined8 *puVar7;
  
  pdVar2 = (record->data).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((long)(record->data).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish - (long)pdVar2 == 0x28) {
    auVar1 = *(undefined1 (*) [16])
              &(record->metadata).fields.
               super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
               super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
               super__Head_base<1UL,_double,_false>;
    auVar3._8_4_ = auVar1._0_4_;
    auVar3._0_8_ = auVar1._8_8_;
    auVar3._12_4_ = auVar1._4_4_;
    *(undefined1 (*) [16])__return_storage_ptr__->_M_elems = auVar3;
    dVar4 = pdVar2[1];
    dVar5 = pdVar2[2];
    dVar6 = pdVar2[3];
    __return_storage_ptr__->_M_elems[2] = *pdVar2;
    __return_storage_ptr__->_M_elems[3] = dVar4;
    __return_storage_ptr__->_M_elems[4] = dVar5;
    __return_storage_ptr__->_M_elems[5] = dVar6;
    __return_storage_ptr__->_M_elems[6] = pdVar2[4];
    return __return_storage_ptr__;
  }
  tools::Log::info<char_const*>("Expected NPL = 5 for the SAMMY parametrisation");
  tools::Log::info<char_const*,long>
            ("Found NPL value: {}",
             (long)(record->data).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(record->data).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start >> 3);
  puVar7 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar7 = getenv;
  __cxa_throw(puVar7,&std::exception::typeinfo,std::exception::~exception);
}

Assistant:

static std::array< double, 7 >
extract( ListRecord&& record ) {

  std::array< double, 7 > values;

  if ( record.NPL() != 5 ) {

    Log::info( "Expected NPL = 5 for the SAMMY parametrisation" );
    Log::info( "Found NPL value: {}", record.NPL() );
    throw std::exception();
  }

  auto list = record.list();
  values[0] = record.C1();
  values[1] = record.C2();
  std::copy_n( ranges::cpp20::begin( list ), 5, values.begin() + 2 );

  return values;
}